

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O3

void re2::CaseInsensitiveMatchAndConsume(void)

{
  char *pcVar1;
  bool bVar2;
  string text;
  StringPiece sp;
  string result;
  Arg *args_1 [1];
  Arg *args [1];
  char *local_228;
  int local_220;
  char local_218 [16];
  StringPiece local_208;
  Arg local_1f8;
  Arg local_1e8;
  undefined1 local_1d8 [16];
  Arg local_1c8;
  Arg *local_1b8;
  LogMessage local_1b0;
  
  local_1e8.parser_ = (Parser)0x0;
  local_1d8[0] = 0;
  local_228 = local_218;
  local_1e8.arg_ = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"A fish named *Wanda*","");
  pcVar1 = local_228;
  local_208.ptr_ = local_228;
  local_208.length_ = local_220;
  RE2::RE2((RE2 *)&local_1b0,"(?i)([wand]{5})");
  local_1b8 = &local_1c8;
  local_1c8.parser_ = RE2::Arg::parse_string;
  local_1f8.arg_ = pcVar1;
  local_1f8.parser_ = (Parser)CONCAT44(local_1f8.parser_._4_4_,local_220);
  local_1c8.arg_ = &local_1e8;
  bVar2 = RE2::PartialMatchN((StringPiece *)&local_1f8,(RE2 *)&local_1b0,&local_1b8,1);
  RE2::~RE2((RE2 *)&local_1b0);
  if (!bVar2) {
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4ce,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,
               "Check failed: RE2::PartialMatch(sp, \"(?i)([wand]{5})\", &result)",0x3f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  }
  RE2::RE2((RE2 *)&local_1b0,"(?i)([wand]{5})");
  local_1f8.parser_ = RE2::Arg::parse_string;
  local_1f8.arg_ = &local_1e8;
  local_1c8.arg_ = &local_1f8;
  bVar2 = RE2::FindAndConsumeN(&local_208,(RE2 *)&local_1b0,(Arg **)&local_1c8,1);
  RE2::~RE2((RE2 *)&local_1b0);
  if (!bVar2) {
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4cf,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,
               "Check failed: RE2::FindAndConsume(&sp, \"(?i)([wand]{5})\", &result)",0x42);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  }
  if (local_228 != local_218) {
    operator_delete(local_228);
  }
  if ((undefined1 *)local_1e8.arg_ != local_1d8) {
    operator_delete(local_1e8.arg_);
  }
  return;
}

Assistant:

TEST(CheckRewriteString, all) {
  TestCheckRewriteString("abc", "foo", true);
  TestCheckRewriteString("abc", "foo\\", false);
  TestCheckRewriteString("abc", "foo\\0bar", true);

  TestCheckRewriteString("a(b)c", "foo", true);
  TestCheckRewriteString("a(b)c", "foo\\0bar", true);
  TestCheckRewriteString("a(b)c", "foo\\1bar", true);
  TestCheckRewriteString("a(b)c", "foo\\2bar", false);
  TestCheckRewriteString("a(b)c", "f\\\\2o\\1o", true);

  TestCheckRewriteString("a(b)(c)", "foo\\12", true);
  TestCheckRewriteString("a(b)(c)", "f\\2o\\1o", true);
  TestCheckRewriteString("a(b)(c)", "f\\oo\\1", false);
}